

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::alloc
          (array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *this,
          int new_len)

{
  CCommand *pCVar1;
  undefined4 in_ESI;
  long *in_RDI;
  int unaff_retaddr;
  int i;
  int end;
  CCommand *new_list;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int local_20;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  pCVar1 = allocator_default<CCommandManager::CCommand>::alloc_array(unaff_retaddr);
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    iVar3 = *(int *)((long)in_RDI + 0xc);
  }
  else {
    iVar3 = (int)in_RDI[1];
  }
  iVar4 = iVar3;
  for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
    memcpy(pCVar1 + local_20,(void *)(*in_RDI + (long)local_20 * 0xa0),0xa0);
  }
  allocator_default<CCommandManager::CCommand>::free_array
            ((CCommand *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    uVar2 = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else {
    uVar2 = (undefined4)in_RDI[1];
  }
  *(undefined4 *)((long)in_RDI + 0xc) = uVar2;
  *in_RDI = (long)pCVar1;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}